

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O3

JoypadStateIter joypad_find_state(JoypadBuffer *buffer,Ticks ticks)

{
  size_t sVar1;
  JoypadState *pJVar2;
  JoypadChunk *chunk;
  JoypadChunk *pJVar3;
  JoypadChunk *pJVar4;
  JoypadState *begin_;
  JoypadState *pJVar5;
  ulong uVar6;
  JoypadState *pJVar7;
  JoypadState *pJVar8;
  JoypadStateIter JVar9;
  
  pJVar4 = (buffer->sentinel).next;
  if (pJVar4->size != 0) {
    pJVar3 = (buffer->sentinel).prev;
    sVar1 = pJVar3->size;
    if (sVar1 != 0) {
      pJVar7 = pJVar4->data;
      if (pJVar7->ticks <= ticks && ticks != pJVar7->ticks) {
        pJVar5 = pJVar3->data;
        if (ticks < pJVar5[sVar1 - 1].ticks) {
          if (ticks - pJVar7->ticks < pJVar5[sVar1 - 1].ticks - ticks) {
            uVar6 = pJVar7[pJVar4->size - 1].ticks;
            pJVar3 = pJVar4;
            while (uVar6 <= ticks) {
              pJVar3 = pJVar3->next;
              uVar6 = pJVar3->data[pJVar3->size - 1].ticks;
            }
          }
          else {
            uVar6 = pJVar5->ticks;
            while (ticks < uVar6) {
              pJVar3 = pJVar3->prev;
              uVar6 = pJVar3->data->ticks;
            }
          }
          if (pJVar3->size == 0) {
LAB_0019b250:
            __assert_fail("lower_bound != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                          ,0x85,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
          }
          pJVar5 = pJVar3->data;
          pJVar8 = pJVar5 + pJVar3->size;
          do {
            uVar6 = (long)pJVar8 - (long)pJVar5 >> 4;
            if ((long)uVar6 < 2) {
              pJVar7 = pJVar5;
              if (pJVar5 == (JoypadState *)0x0) goto LAB_0019b250;
              break;
            }
            pJVar7 = (JoypadState *)(pJVar5->padding + (uVar6 & 0xfffffffffffffffe) * 8 + -9);
            pJVar2 = pJVar7;
            if (pJVar7->ticks <= ticks) {
              pJVar5 = pJVar7;
              pJVar2 = pJVar8;
            }
            pJVar8 = pJVar2;
          } while (pJVar7->ticks != ticks);
          pJVar4 = pJVar3;
          if (ticks < pJVar7->ticks) {
            __assert_fail("result.state->ticks <= ticks",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                          ,0x88,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
          }
        }
        else {
          pJVar7 = pJVar5 + (sVar1 - 1);
          pJVar4 = pJVar3;
        }
      }
      JVar9.state = pJVar7;
      JVar9.chunk = pJVar4;
      return JVar9;
    }
  }
  __assert_fail("first_chunk->size != 0 && last_chunk->size != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",0x65
                ,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
}

Assistant:

JoypadStateIter joypad_find_state(JoypadBuffer* buffer, Ticks ticks) {
  /* TODO(binji): Use a skip list if this is too slow? */
  JoypadStateIter result;
  JoypadChunk* first_chunk = buffer->sentinel.next;
  JoypadChunk* last_chunk = buffer->sentinel.prev;
  assert(first_chunk->size != 0 && last_chunk->size != 0);
  Ticks first_ticks = first_chunk->data[0].ticks;
  Ticks last_ticks = last_chunk->data[last_chunk->size - 1].ticks;
  if (ticks <= first_ticks) {
    /* At or past the beginning. */
    result.chunk = first_chunk;
    result.state = &first_chunk->data[0];
    return result;
  } else if (ticks >= last_ticks) {
    /* At or past the end. */
    result.chunk = last_chunk;
    result.state = &last_chunk->data[last_chunk->size - 1];
    return result;
  } else if (ticks - first_ticks < last_ticks - ticks) {
    /* Closer to the beginning. */
    JoypadChunk* chunk = first_chunk;
    while (ticks >= chunk->data[chunk->size - 1].ticks) {
      chunk = chunk->next;
    }
    result.chunk = chunk;
  } else {
    /* Closer to the end. */
    JoypadChunk* chunk = last_chunk;
    while (ticks < chunk->data[0].ticks) {
      chunk = chunk->prev;
    }
    result.chunk = chunk;
  }

  JoypadState* begin = result.chunk->data;
  JoypadState* end = begin + result.chunk->size;
  LOWER_BOUND(JoypadState, lower_bound, begin, end, ticks, GET_TICKS, CMP_LT);
  assert(lower_bound != NULL); /* The chunk should not be empty. */

  result.state = lower_bound;
  assert(result.state->ticks <= ticks);
  return result;
}